

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_remove.c
# Opt level: O1

void * linkedlist_remove(s_linkedlist *linked_list,uint index)

{
  s_linkedlist_node *psVar1;
  void *pvVar2;
  s_linkedlist_node *psVar3;
  int iVar4;
  s_linkedlist_node *__ptr;
  
  __ptr = linked_list->head;
  if (__ptr != (s_linkedlist_node *)0x0) {
    iVar4 = index + 1;
    do {
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        psVar1 = __ptr->previous;
        psVar3 = psVar1;
        if (psVar1 == (s_linkedlist_node *)0x0) {
          psVar3 = (s_linkedlist_node *)linked_list;
        }
        psVar3->next = __ptr->next;
        psVar3 = (s_linkedlist_node *)&linked_list->tail;
        if (__ptr->next != (s_linkedlist_node *)0x0) {
          psVar3 = __ptr->next;
        }
        psVar3->previous = psVar1;
        pvVar2 = __ptr->element;
        free(__ptr);
        linked_list->size = linked_list->size - 1;
        return pvVar2;
      }
      __ptr = __ptr->next;
    } while (__ptr != (s_linkedlist_node *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void *linkedlist_remove(s_linkedlist *linked_list, unsigned int index) {
    s_linkedlist_node *node = linked_list->head;

    while (node != NULL) {
        if (index == 0) {
            if (node->previous == NULL) {
                linked_list->head = node->next;
            } else {
                node->previous->next = node->next;
            }

            if (node->next == NULL) {
                linked_list->tail = node->previous;
            } else {
                node->next->previous = node->previous;
            }

            void *element_to_return = node->element;

            free(node);
            linked_list->size -= 1;

            return (element_to_return);
        }

        index -= 1;
        node = node->next;
    }

    return (NULL);
}